

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

llama_context * llama_init_from_model(llama_model *model,llama_context_params params)

{
  ulong uVar1;
  long in_RDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  byte in_stack_0000006b;
  exception *err;
  llama_context *ctx;
  llama_model *in_stack_00000518;
  llama_context *in_stack_00000520;
  llama_context_params in_stack_00000530;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 *local_c8;
  llama_context *local_c0;
  undefined8 *local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  llama_context *local_8;
  
  local_b8 = (undefined8 *)&stack0x00000008;
  if (in_RDI == 0) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: model cannot be NULL\n","llama_init_from_model");
    local_8 = (llama_context *)0x0;
  }
  else if ((in_stack_0000000c == 0) && (in_stack_00000010 == 0)) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: n_batch and n_ubatch cannot both be zero\n",
                       "llama_init_from_model");
    local_8 = (llama_context *)0x0;
  }
  else if ((in_stack_00000008 == 0) && (*(int *)(in_RDI + 0x2c) == 0)) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: n_ctx and model->hparams.n_ctx_train cannot both be zero\n",
                       "llama_init_from_model");
    local_8 = (llama_context *)0x0;
  }
  else {
    if (((in_stack_0000006b & 1) != 0) && (*(int *)(in_RDI + 4) == 5)) {
      llama_log_internal(GGML_LOG_LEVEL_WARN,
                         "%s: flash_attn is not compatible with Grok - forcing off\n",
                         "llama_init_from_model");
      *(undefined1 *)((long)local_b8 + 99) = 0;
    }
    uVar1 = ggml_is_quantized(*(undefined4 *)((long)local_b8 + 0x5c));
    if (((uVar1 & 1) == 0) || ((*(byte *)((long)local_b8 + 99) & 1) != 0)) {
      local_c0 = (llama_context *)operator_new(0x398);
      local_d8 = local_b8[0xe];
      local_e8 = local_b8[0xc];
      uStack_e0 = local_b8[0xd];
      local_f8 = local_b8[10];
      uStack_f0 = local_b8[0xb];
      local_108 = local_b8[8];
      uStack_100 = local_b8[9];
      local_148 = *local_b8;
      uStack_140 = local_b8[1];
      local_138 = local_b8[2];
      uStack_130 = local_b8[3];
      local_128 = local_b8[4];
      uStack_120 = local_b8[5];
      local_118 = local_b8[6];
      uStack_110 = local_b8[7];
      local_c8 = (undefined1 *)&local_148;
      local_a8 = local_148;
      uStack_a0 = uStack_140;
      local_98 = local_138;
      uStack_90 = uStack_130;
      llama_context::llama_context(in_stack_00000520,in_stack_00000518,in_stack_00000530);
      local_8 = local_c0;
    }
    else {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: V cache quantization requires flash_attn\n",
                         "llama_init_from_model");
      local_8 = (llama_context *)0x0;
    }
  }
  return local_8;
}

Assistant:

llama_context * llama_init_from_model(
                 llama_model * model,
        llama_context_params   params) {
    if (!model) {
        LLAMA_LOG_ERROR("%s: model cannot be NULL\n", __func__);
        return nullptr;
    }

    if (params.n_batch == 0 && params.n_ubatch == 0) {
        LLAMA_LOG_ERROR("%s: n_batch and n_ubatch cannot both be zero\n", __func__);
        return nullptr;
    }

    if (params.n_ctx == 0 && model->hparams.n_ctx_train == 0) {
        LLAMA_LOG_ERROR("%s: n_ctx and model->hparams.n_ctx_train cannot both be zero\n", __func__);
        return nullptr;
    }

    if (params.flash_attn && model->arch == LLM_ARCH_GROK) {
        LLAMA_LOG_WARN("%s: flash_attn is not compatible with Grok - forcing off\n", __func__);
        params.flash_attn = false;
    }

    if (ggml_is_quantized(params.type_v) && !params.flash_attn) {
        LLAMA_LOG_ERROR("%s: V cache quantization requires flash_attn\n", __func__);
        return nullptr;
    }

    try {
        auto * ctx = new llama_context(*model, params);
        return ctx;
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: failed to initialize the context: %s\n", __func__, err.what());
    }

    return nullptr;
}